

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O0

void info_print_leaflist(lyout *out,lys_node *node)

{
  lys_node_leaflist *llist;
  lys_node *node_local;
  lyout *out_local;
  
  ly_print(out,"%-*s%s\n",0xb,"Leaflist: ",node->name);
  ly_print(out,"%-*s%s\n",0xb,"Module: ",node->module->name);
  info_print_text(out,node->dsc,"Desc: ");
  info_print_text(out,node->ref,"Reference: ");
  info_print_flags(out,node->flags,0x13b,1);
  info_print_text(out,(char *)(node[1].iffeature)->expr,"Type: ");
  info_print_text(out,(char *)node[1].next,"Units: ");
  info_print_list_constr(out,*(uint32_t *)&node[1].priv,*(uint32_t *)((long)&node[1].priv + 4));
  info_print_if_feature(out,node->module,node->iffeature,node->iffeature_size);
  info_print_when(out,(lys_when *)node[1].name);
  info_print_must(out,(lys_restr *)node[1].dsc,node->padding[3]);
  return;
}

Assistant:

static void
info_print_leaflist(struct lyout *out, const struct lys_node *node)
{
    struct lys_node_leaflist *llist = (struct lys_node_leaflist *)node;

    ly_print(out, "%-*s%s\n", INDENT_LEN, "Leaflist: ", llist->name);
    ly_print(out, "%-*s%s\n", INDENT_LEN, "Module: ", llist->module->name);
    info_print_text(out, llist->dsc, "Desc: ");
    info_print_text(out, llist->ref, "Reference: ");
    info_print_flags(out, llist->flags, LYS_CONFIG_MASK | LYS_STATUS_MASK | LYS_USERORDERED, 1);
    info_print_text(out, llist->type.der->name, "Type: ");
    info_print_text(out, llist->units, "Units: ");
    info_print_list_constr(out, llist->min, llist->max);
    info_print_if_feature(out, llist->module, llist->iffeature, llist->iffeature_size);
    info_print_when(out, llist->when);
    info_print_must(out, llist->must, llist->must_size);
}